

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderprogram.cpp
# Opt level: O0

void __thiscall
graphics101::ShaderProgram::setUniform
          (ShaderProgram *this,string *name,
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          *value)

{
  GLint location;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *value_local;
  string *name_local;
  ShaderProgram *this_local;
  
  use(this);
  location = anon_unknown.dwarf_e4a37::location(this->m_program,name);
  (anonymous_namespace)::
  bind_uniform<std::vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>>
            (location,value);
  return;
}

Assistant:

void ShaderProgram::setUniform( const std::string& name, const std::vector< vec2 >& value ) {
    use();
    bind_uniform( location( m_program, name ), value );
}